

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

char * base64_encode(char *buffer,uint len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  pcVar4 = (char *)calloc(1,(ulong)((len * 4) / 3 + 4));
  if (pcVar4 != (char *)0x0) {
    if (len == 0) {
      lVar5 = 0;
    }
    else {
      lVar3 = 4;
      do {
        lVar5 = lVar3;
        bVar1 = *buffer;
        pcVar4[lVar5 + -4] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
        if (len == 1) {
          buffer = (char *)((byte *)buffer + 1);
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)((byte *)buffer)[1];
          buffer = (char *)((byte *)buffer + 2);
        }
        pcVar4[lVar5 + -3] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [uVar7 >> 4 | (bVar1 & 3) << 4];
        iVar2 = (int)lVar5;
        if (len == 1) {
          pcVar4[iVar2 - 2] = '=';
          uVar6 = (ulong)(iVar2 - 4) | 3;
LAB_001053cb:
          pcVar4[uVar6] = '=';
          break;
        }
        uVar8 = 0;
        if (len != 2) {
          uVar8 = (uint)(byte)*buffer;
          buffer = (char *)((byte *)buffer + 1);
        }
        pcVar4[lVar5 + -2] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(uVar8 >> 6) + (uVar7 & 0xf) * 4];
        if (len == 2) {
          uVar6 = (ulong)(iVar2 - 1);
          goto LAB_001053cb;
        }
        pcVar4[lVar5 + -1] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8 & 0x3f];
        len = len - 3;
        lVar3 = lVar5 + 4;
      } while (len != 0);
    }
    pcVar4[(int)lVar5] = '\0';
  }
  return pcVar4;
}

Assistant:

static char *
base64_encode(char *buffer, unsigned int len)
{
    char * buf;
    int buflen = 0;
    int c1, c2, c3;
    int maxlen = len*4/3 + 4;
#ifdef OVERKILL
    maxlen = len*2 + 2;
#endif

    buf = malloc(maxlen * sizeof(char));
    if(buf == NULL) {
	return NULL;
    } else {
	memset(buf, 0, maxlen * sizeof(char));
    }

    while (len) {
	
	c1 = (unsigned char)*buffer++;
	buf[buflen++] = num_to_char[c1>>2];

	if (--len == 0) c2 = 0;
	else c2 = (unsigned char)*buffer++;
	buf[buflen++] = num_to_char[((c1 & 0x3)<< 4) | ((c2 & 0xf0) >> 4)];

	if (len == 0) {
	    buf[buflen++] = '=';
	    buf[buflen++] = '=';
	    break;
	}

	if (--len == 0) c3 = 0;
	else c3 = (unsigned char)*buffer++;

	buf[buflen++] = num_to_char[((c2 & 0xf) << 2) | ((c3 & 0xc0) >>6)];
	if (len == 0) {
	    buf[buflen++] = '=';

	    break;
	}

	--len;
	buf[buflen++] = num_to_char[c3 & 0x3f];

    }

    buf[buflen]=0;

    return buf;
}